

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_SequenceNumberRecovery::_Run(_Test_SequenceNumberRecovery *this)

{
  string v;
  Status local_218;
  Status local_210;
  undefined8 local_208;
  undefined1 local_1f9;
  char *local_1f8;
  undefined8 uStack_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  Tester local_1c8;
  
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x10f;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_218.state_._0_1_ = 0;
  local_1e8._M_dataplus._M_p = "foo";
  local_1e8._M_string_length = 3;
  local_1f8 = "v1";
  uStack_1f0 = 2;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[2])(&local_210);
  test::Tester::IsOk(&local_1c8,&local_210);
  if (local_210.state_ != (char *)0x0) {
    operator_delete__(local_210.state_);
  }
  test::Tester::~Tester(&local_1c8);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x110;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_218.state_._0_1_ = 0;
  local_1e8._M_dataplus._M_p = "foo";
  local_1e8._M_string_length = 3;
  local_1f8 = "v2";
  uStack_1f0 = 2;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[2])(&local_210);
  test::Tester::IsOk(&local_1c8,&local_210);
  if (local_210.state_ != (char *)0x0) {
    operator_delete__(local_210.state_);
  }
  test::Tester::~Tester(&local_1c8);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x111;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_218.state_._0_1_ = 0;
  local_1e8._M_dataplus._M_p = "foo";
  local_1e8._M_string_length = 3;
  local_1f8 = "v3";
  uStack_1f0 = 2;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[2])(&local_210);
  test::Tester::IsOk(&local_1c8,&local_210);
  if (local_210.state_ != (char *)0x0) {
    operator_delete__(local_210.state_);
  }
  test::Tester::~Tester(&local_1c8);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x112;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_218.state_._0_1_ = 0;
  local_1e8._M_dataplus._M_p = "foo";
  local_1e8._M_string_length = 3;
  local_1f8 = "v4";
  uStack_1f0 = 2;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[2])(&local_210);
  test::Tester::IsOk(&local_1c8,&local_210);
  if (local_210.state_ != (char *)0x0) {
    operator_delete__(local_210.state_);
  }
  test::Tester::~Tester(&local_1c8);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x113;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_218.state_._0_1_ = 0;
  local_1e8._M_dataplus._M_p = "foo";
  local_1e8._M_string_length = 3;
  local_1f8 = "v5";
  uStack_1f0 = 2;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[2])(&local_210);
  test::Tester::IsOk(&local_1c8,&local_210);
  if (local_210.state_ != (char *)0x0) {
    operator_delete__(local_210.state_);
  }
  test::Tester::~Tester(&local_1c8);
  CorruptionTest::RepairDB(&this->super_CorruptionTest);
  CorruptionTest::Reopen(&this->super_CorruptionTest);
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x117;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_1f8 = (char *)0x100;
  uStack_1f0 = 0;
  local_210.state_ = "foo";
  local_208 = 3;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[5])(&local_218);
  test::Tester::IsOk(&local_1c8,&local_218);
  if ((void *)CONCAT71(local_218.state_._1_7_,local_218.state_._0_1_) != (void *)0x0) {
    operator_delete__((void *)CONCAT71(local_218.state_._1_7_,local_218.state_._0_1_));
  }
  test::Tester::~Tester(&local_1c8);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x118;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1c8,(char (*) [3])"v5",&local_1e8);
  test::Tester::~Tester(&local_1c8);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x11b;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_1f9 = 0;
  local_1f8 = "foo";
  uStack_1f0 = 3;
  local_210.state_ = "v6";
  local_208 = 2;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[2])(&local_218);
  test::Tester::IsOk(&local_1c8,&local_218);
  if ((void *)CONCAT71(local_218.state_._1_7_,local_218.state_._0_1_) != (void *)0x0) {
    operator_delete__((void *)CONCAT71(local_218.state_._1_7_,local_218.state_._0_1_));
  }
  test::Tester::~Tester(&local_1c8);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x11c;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_1f8 = (char *)0x100;
  uStack_1f0 = 0;
  local_210.state_ = "foo";
  local_208 = 3;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[5])(&local_218);
  test::Tester::IsOk(&local_1c8,&local_218);
  if ((void *)CONCAT71(local_218.state_._1_7_,local_218.state_._0_1_) != (void *)0x0) {
    operator_delete__((void *)CONCAT71(local_218.state_._1_7_,local_218.state_._0_1_));
  }
  test::Tester::~Tester(&local_1c8);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x11d;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1c8,(char (*) [3])"v6",&local_1e8);
  test::Tester::~Tester(&local_1c8);
  CorruptionTest::Reopen(&this->super_CorruptionTest);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x11f;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_1f8 = (char *)0x100;
  uStack_1f0 = 0;
  local_210.state_ = "foo";
  local_208 = 3;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[5])(&local_218);
  test::Tester::IsOk(&local_1c8,&local_218);
  if ((void *)CONCAT71(local_218.state_._1_7_,local_218.state_._0_1_) != (void *)0x0) {
    operator_delete__((void *)CONCAT71(local_218.state_._1_7_,local_218.state_._0_1_));
  }
  test::Tester::~Tester(&local_1c8);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x120;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1c8,(char (*) [3])"v6",&local_1e8);
  test::Tester::~Tester(&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(CorruptionTest, SequenceNumberRecovery) {
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v1"));
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v2"));
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v3"));
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v4"));
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v5"));
  RepairDB();
  Reopen();
  std::string v;
  ASSERT_OK(db_->Get(ReadOptions(), "foo", &v));
  ASSERT_EQ("v5", v);
  // Write something.  If sequence number was not recovered properly,
  // it will be hidden by an earlier write.
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v6"));
  ASSERT_OK(db_->Get(ReadOptions(), "foo", &v));
  ASSERT_EQ("v6", v);
  Reopen();
  ASSERT_OK(db_->Get(ReadOptions(), "foo", &v));
  ASSERT_EQ("v6", v);
}